

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidReorganizeDataBlockSize(void)

{
  ModelDescription *pMVar1;
  FeatureType *pFVar2;
  ReorganizeDataLayerParams *pRVar3;
  ostream *poVar4;
  Result local_a8;
  NeuralNetworkLayer *layer;
  NeuralNetwork *nn;
  ArrayFeatureType *outShape;
  FeatureDescription *output;
  ArrayFeatureType *shape;
  FeatureDescription *local_48;
  FeatureDescription *input;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&input);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&input);
  local_48 = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(local_48,"input");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(local_48);
  output = (FeatureDescription *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)output,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)output,0x12);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)output,5);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)output,7);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&input);
  outShape = (ArrayFeatureType *)CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)outShape,"output");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outShape);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type((FeatureDescription *)outShape);
  nn = (NeuralNetwork *)CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,1);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,2);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,0xf);
  CoreML::Specification::ArrayFeatureType::add_shape((ArrayFeatureType *)nn,0x15);
  layer = (NeuralNetworkLayer *)CoreML::Specification::Model::mutable_neuralnetwork((Model *)&input)
  ;
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping
            ((NeuralNetwork *)layer,EXACT_ARRAY_MAPPING);
  local_a8.m_message._M_storage._M_storage =
       (uchar  [8])CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)layer);
  CoreML::Specification::NeuralNetworkLayer::add_input
            ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output
            ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage,"output");
  pRVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_reorganizedata
                     ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage);
  CoreML::Specification::ReorganizeDataLayerParams::set_mode
            (pRVar3,ReorganizeDataLayerParams_ReorganizationType_DEPTH_TO_SPACE);
  pRVar3 = CoreML::Specification::NeuralNetworkLayer::mutable_reorganizedata
                     ((NeuralNetworkLayer *)local_a8.m_message._M_storage._M_storage);
  CoreML::Specification::ReorganizeDataLayerParams::set_blocksize(pRVar3,1);
  CoreML::validate<(MLModelType)500>(&local_a8,(Model *)&input);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_a8);
  if (m._oneof_case_[0]._0_1_) {
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar4 = std::operator<<(poVar4,":");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x17c2);
    poVar4 = std::operator<<(poVar4,": error: ");
    poVar4 = std::operator<<(poVar4,"!((res).good())");
    poVar4 = std::operator<<(poVar4," was false, expected true.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_a8);
  CoreML::Specification::Model::~Model((Model *)&input);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidReorganizeDataBlockSize() {
    // Tests that the validator rejects layers with an impossible block size.
    // (Block size for a reorganizeData layer must be greater than 1).
    Specification::Model m;
    Specification::FeatureDescription* input = m.mutable_description()->add_input();
    input->set_name("input");
    Specification::ArrayFeatureType* shape = input->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    shape->add_shape(18);
    shape->add_shape(5);
    shape->add_shape(7);

    Specification::FeatureDescription* output = m.mutable_description()->add_output();
    output->set_name("output");
    output->mutable_type()->mutable_multiarraytype();
    Specification::ArrayFeatureType* outShape = output->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(1);
    outShape->add_shape(2);
    outShape->add_shape(15);
    outShape->add_shape(21);

    Specification::NeuralNetwork* nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    Specification::NeuralNetworkLayer* layer = nn->add_layers();
    layer->add_input("input");
    layer->add_output("output");
    layer->mutable_reorganizedata()->set_mode(Specification::ReorganizeDataLayerParams::DEPTH_TO_SPACE);
    layer->mutable_reorganizedata()->set_blocksize(1);

    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);

    return 0;
}